

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_int16 *
drwav_open_memory_and_read_pcm_frames_s16
          (void *data,size_t dataSize,uint *channelsOut,uint *sampleRateOut,
          drwav_uint64 *totalFrameCountOut,drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_bool32 dVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined8 *in_R8;
  drwav wav;
  drwav_allocation_callbacks *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  void *in_stack_fffffffffffffe18;
  drwav *in_stack_fffffffffffffe20;
  uint *in_stack_fffffffffffffe28;
  uint *in_stack_fffffffffffffe30;
  drwav *in_stack_fffffffffffffe38;
  undefined8 local_8;
  
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  dVar1 = drwav_init_memory(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                            in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if (dVar1 == 0) {
    local_8 = (drwav_int16 *)0x0;
  }
  else {
    local_8 = drwav__read_pcm_frames_and_close_s16
                        (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe28,(drwav_uint64 *)in_stack_fffffffffffffe20);
  }
  return local_8;
}

Assistant:

DRWAV_API drwav_int16* drwav_open_memory_and_read_pcm_frames_s16(const void* data, size_t dataSize, unsigned int* channelsOut, unsigned int* sampleRateOut, drwav_uint64* totalFrameCountOut, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    drwav wav;

    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }

    if (!drwav_init_memory(&wav, data, dataSize, pAllocationCallbacks)) {
        return NULL;
    }

    return drwav__read_pcm_frames_and_close_s16(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}